

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnReassignment
          (RALocalAllocator *this,RegGroup group,uint32_t workId,uint32_t physId,
          RegMask allocableRegs,RAInst *raInst)

{
  uint **ppuVar1;
  uint **ppuVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  WorkToPhysMap *pWVar7;
  PhysToWorkMap *pPVar8;
  PhysToWorkMap *pPVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  RegGroup RVar13;
  uint uVar14;
  uint uVar15;
  Error EVar16;
  uint32_t uVar17;
  RABlock *pRVar18;
  BaseNode *pBVar19;
  ulong uVar20;
  RABlock *block;
  uint uVar21;
  ulong unaff_RBX;
  ulong unaff_RBP;
  undefined7 in_register_00000031;
  BaseNode *pBVar22;
  InstNode *node;
  BaseCompiler *pBVar23;
  RALocalAllocator *this_00;
  undefined4 in_register_00000084;
  uint *puVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  ulong unaff_R12;
  InstNode *pIVar28;
  uint uVar29;
  long lVar30;
  bool bVar31;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  long lStack_b8;
  ulong uStack_b0;
  InstNode *pIStack_a8;
  RALocalAllocator *pRStack_a0;
  long lStack_98;
  code *pcStack_90;
  ulong uStack_80;
  RALocalAllocator *pRStack_78;
  InstNode *pIStack_70;
  BaseNode *pBStack_68;
  ulong uStack_60;
  ulong uStack_58;
  
  puVar24 = (uint *)CONCAT44(in_register_00000084,allocableRegs);
  pBVar22 = (BaseNode *)CONCAT71(in_register_00000031,group);
  if (allocableRegs == 0) {
    decideOnReassignment();
LAB_0012385b:
    workId = physId;
    decideOnReassignment();
  }
  else {
    physId = physId;
    if (*(uint *)&this->_pass->field_0x148 <= workId) goto LAB_0012385b;
    lVar30 = *(long *)(*(long *)&this->_pass->_workRegs + (ulong)workId * 8);
    bVar3 = *(byte *)(lVar30 + 0x4a);
    if ((bVar3 != 0xff) && ((allocableRegs >> (bVar3 & 0x1f) & 1) != 0)) {
      return (uint)bVar3;
    }
    if (group < kPC) {
      bVar3 = *(byte *)((long)(raInst->_liveCount).n._data + ((ulong)group - 4));
      if (bVar3 != 0) {
        uVar14 = (raInst->_tiedIndex).super_RARegCount.field_0._packed >> (group * '\b' & 0x1f) &
                 0xff;
        lVar26 = 0;
        do {
          if (*(uint32_t *)((long)&raInst->_tiedRegs[0]._workId + lVar26 + (ulong)(uVar14 << 5)) ==
              workId) {
            if ((*(uint *)((long)&raInst->_tiedRegs[0]._flags + lVar26 + (ulong)(uVar14 << 5)) &
                0x40008) != 0) {
              uVar17 = 0;
              if (allocableRegs == 0) {
                return 0;
              }
              for (; (allocableRegs >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
              return uVar17;
            }
            break;
          }
          lVar26 = lVar26 + 0x20;
        } while ((ulong)bVar3 * 0x20 != lVar26);
      }
      if ((*(byte *)(lVar30 + 0x24) & 4) != 0) {
        return 0xff;
      }
      uVar14 = ~*(uint *)(lVar30 + 0x38) & allocableRegs;
      if (uVar14 == 0) {
        return 0xff;
      }
      uVar15 = ~(this->_funcPreservedRegs)._masks._data[group] & uVar14;
      if (uVar15 == 0) {
        uVar15 = uVar14;
      }
      uVar17 = 0;
      if (uVar15 == 0) {
        return 0;
      }
      for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
      }
      return uVar17;
    }
  }
  decideOnReassignment();
  if (workId == 0) {
LAB_00123944:
    decideOnSpillFor();
  }
  else if ((byte)pBVar22 < 4) {
    uVar14 = 0;
    if (workId != 0) {
      for (; (workId >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
      }
    }
    uVar27 = (ulong)pBVar22 & 0xff;
    pBVar22 = (BaseNode *)(this->_curAssignment)._physToWorkIds._data[uVar27];
    uVar15 = *(uint *)(pBVar22 + (ulong)uVar14 * 4);
    uVar20 = (ulong)uVar15;
    uVar25 = workId - 1 & workId;
    if (uVar25 == 0) {
LAB_00123933:
      *puVar24 = uVar15;
      return uVar14;
    }
    uVar4 = *(uint *)&this->_pass->field_0x148;
    if (uVar15 < uVar4) {
      lVar30 = *(long *)&this->_pass->_workRegs;
      uVar21 = (uint)(*(float *)(*(long *)(lVar30 + uVar20 * 8) + 100) * 1048576.0);
      uVar5 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[uVar27];
      this = (RALocalAllocator *)(ulong)uVar5;
      uVar15 = uVar21 + 0x40000;
      if ((uVar5 >> (uVar14 & 0x1f) & 1) == 0) {
        uVar15 = uVar21;
      }
      uVar27 = (ulong)uVar15;
      do {
        uVar21 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        unaff_RBX = (ulong)uVar21;
        uVar15 = *(uint *)(pBVar22 + unaff_RBX * 4);
        if (uVar4 <= uVar15) {
          decideOnSpillFor();
          goto LAB_00123944;
        }
        uVar29 = (uint)(*(float *)(*(long *)(lVar30 + (ulong)uVar15 * 8) + 100) * 1048576.0);
        uVar12 = uVar29 + 0x40000;
        if ((uVar5 >> (uVar21 & 0x1f) & 1) == 0) {
          uVar12 = uVar29;
        }
        unaff_R12 = (ulong)uVar12;
        bVar31 = uVar12 < (uint)uVar27;
        if (bVar31) {
          uVar20 = (ulong)uVar15;
          uVar27 = unaff_R12;
        }
        uVar15 = (uint)uVar20;
        if (bVar31) {
          uVar14 = uVar21;
        }
        uVar25 = uVar25 - 1 & uVar25;
        unaff_RBP = (ulong)uVar25;
      } while (uVar25 != 0);
      goto LAB_00123933;
    }
    goto LAB_0012394e;
  }
  decideOnSpillFor();
LAB_0012394e:
  decideOnSpillFor();
  lVar30 = *(long *)(pBVar22 + 0x20);
  node = (InstNode *)(ulong)*(uint *)(lVar30 + 0x10);
  if (node != (InstNode *)0x0) {
    pRStack_78 = (RALocalAllocator *)&this->_curAssignment;
    lVar26 = lVar30 + 0x54;
    pIVar28 = (InstNode *)0x0;
    this_00 = this;
    pIStack_70 = node;
    pBStack_68 = pBVar22;
    uStack_60 = unaff_RBX;
    uStack_58 = unaff_R12;
    do {
      if ((InstNode *)(ulong)*(uint *)(lVar30 + 0x10) <= pIVar28) {
        pcStack_90 = (code *)0x123a70;
        spillAfterAllocation();
LAB_00123a70:
        pcStack_90 = (code *)0x123a75;
        spillAfterAllocation();
LAB_00123a75:
        pcStack_90 = (code *)0x123a7a;
        spillAfterAllocation();
LAB_00123a7a:
        pcStack_90 = (code *)0x123a7f;
        spillAfterAllocation();
LAB_00123a7f:
        pcStack_90 = allocBranch;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
        lStack_b8 = lVar26;
        uStack_b0 = unaff_R12;
        pIStack_a8 = pIVar28;
        pRStack_a0 = this;
        lStack_98 = lVar30;
        pcStack_90 = (code *)unaff_RBP;
        if ((*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) &&
           (EVar16 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                        (ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true),
           EVar16 != 0)) {
          return EVar16;
        }
        EVar16 = allocInst(this_00,node);
        if (EVar16 != 0) {
          return EVar16;
        }
        uVar14 = *(uint *)(block + 0xb8);
        if ((ulong)uVar14 == 0xffffffff) {
          pRVar18 = block + 0xbc;
LAB_00123b18:
          EVar16 = spillScratchGpRegsBeforeEntry(this_00,*(RegMask *)pRVar18);
          if (EVar16 != 0) {
            return EVar16;
          }
          if (*(long *)(block + 200) == 0) {
            EVar16 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar16 != 0) {
              return EVar16;
            }
          }
          else {
            pBVar22 = *(BaseNode **)this_00->_pass->_extraBlock;
            pBVar19 = BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,pBVar22);
            pWVar7 = (this_00->_curAssignment)._workToPhysMap;
            memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap
                   ,(ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
            memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar7,
                   (ulong)(this_00->_tmpAssignment)._layout.workCount);
            EVar16 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                        (ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
            if (EVar16 != 0) {
              return EVar16;
            }
            pBVar23 = this_00->_cc;
            if ((pBVar23->super_BaseBuilder)._cursor != pBVar22) {
              if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_00123cba;
              lVar30 = (ulong)((byte)node[0x12] - 1) * 0x10;
              if ((*(uint *)(node + lVar30 + 0x40) & 7) != 5) goto LAB_00123cbf;
              (*(pBVar23->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_e0);
              uStack_d0 = *(undefined8 *)(node + lVar30 + 0x40);
              uStack_c8 = *(undefined8 *)(node + lVar30 + 0x48);
              *(undefined4 *)(node + lVar30 + 0x40) = uStack_e0;
              *(undefined4 *)(node + lVar30 + 0x44) = uStack_dc;
              *(undefined4 *)(node + lVar30 + 0x48) = uStack_d8;
              *(undefined4 *)(node + lVar30 + 0x4c) = uStack_d4;
              node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
              uVar17 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
              if (uVar17 != 0) {
                return uVar17;
              }
              pBVar23 = this_00->_cc;
              (pBVar23->super_BaseBuilder)._cursor = pBVar22;
              (*(pBVar23->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar23,&uStack_e0);
              pBVar23 = this_00->_cc;
            }
            (pBVar23->super_BaseBuilder)._cursor = pBVar19;
            pWVar7 = (this_00->_curAssignment)._workToPhysMap;
            pPVar8 = (this_00->_curAssignment)._physToWorkMap;
            pPVar9 = (this_00->_tmpAssignment)._physToWorkMap;
            (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
            (this_00->_curAssignment)._physToWorkMap = pPVar9;
            (this_00->_tmpAssignment)._workToPhysMap = pWVar7;
            (this_00->_tmpAssignment)._physToWorkMap = pPVar8;
            lVar30 = 0;
            do {
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar30;
              puVar24 = *ppuVar1;
              puVar10 = ppuVar1[1];
              ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar30;
              puVar11 = ppuVar2[1];
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar30;
              *ppuVar1 = *ppuVar2;
              ppuVar1[1] = puVar11;
              ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar30;
              *ppuVar1 = puVar24;
              ppuVar1[1] = puVar10;
              lVar30 = lVar30 + 2;
            } while (lVar30 != 4);
          }
          uVar17 = 0;
        }
        else {
          if (uVar14 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar18 = (RABlock *)((ulong)uVar14 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_00123b18;
          }
          allocBranch();
LAB_00123cba:
          allocBranch();
LAB_00123cbf:
          uVar17 = 3;
        }
        return uVar17;
      }
      if ((*(byte *)(lVar26 + 2) & 2) != 0) {
        uVar14 = *(uint *)(lVar26 + -8);
        unaff_R12 = (ulong)uVar14;
        if (*(uint *)&this->_pass->field_0x148 <= uVar14) goto LAB_00123a70;
        lVar6 = *(long *)(*(long *)&this->_pass->_workRegs + unaff_R12 * 8);
        if (*(char *)(lVar6 + 0x4a) != -1) goto LAB_00123a4a;
        if ((this->_curAssignment)._layout.workCount <= uVar14) goto LAB_00123a75;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_RBP = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_00123a4a;
        RVar13 = *(RegGroup *)(lVar6 + 0x21);
        (this->_cc->super_BaseBuilder)._cursor = pBStack_68;
        if (0x1f < bVar3) goto LAB_00123a7a;
        RVar13 = RVar13 & kMaxValue;
        if (RVar13 < kPC) {
          if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar13] >>
               (bVar3 & 0x1f) & 1) != 0) {
            pcStack_90 = (code *)0x123a2d;
            uStack_80 = (ulong)RVar13;
            EVar16 = onSaveReg(this,RVar13,uVar14,(uint)bVar3);
            RVar13 = (RegGroup)uStack_80;
            if (EVar16 != 0) {
              return EVar16;
            }
          }
          pcStack_90 = (code *)0x123a45;
          this_00 = pRStack_78;
          RAAssignment::unassign((RAAssignment *)pRStack_78,RVar13,uVar14,(uint)bVar3);
          node = pIStack_70;
          goto LAB_00123a4a;
        }
        goto LAB_00123a7f;
      }
LAB_00123a4a:
      pIVar28 = pIVar28 + 1;
      lVar26 = lVar26 + 0x20;
    } while (node != pIVar28);
  }
  return 0;
}

Assistant:

uint32_t RALocalAllocator::decideOnReassignment(RegGroup group, uint32_t workId, uint32_t physId, RegMask allocableRegs, RAInst* raInst) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer reassignment back to HomeId, if possible.
  if (workReg->hasHomeRegId()) {
    if (Support::bitTest(allocableRegs, workReg->homeRegId())) {
      return workReg->homeRegId();
    }
  }

  // Prefer assignment to a temporary register in case this register is killed by the instruction (or has an out slot).
  const RATiedReg* tiedReg = raInst->tiedRegForWorkReg(group, workId);
  if (tiedReg && tiedReg->isOutOrKill()) {
    return Support::ctz(allocableRegs);
  }

  // Prefer reassignment if this register is only used within a single basic block.
  if (workReg->isWithinSingleBasicBlock()) {
    RegMask filteredRegs = allocableRegs & ~workReg->clobberSurvivalMask();
    if (filteredRegs) {
      return pickBestSuitableRegister(group, filteredRegs);
    }
  }

  // TODO: [Register Allocator] This could be improved.

  // Decided to SPILL.
  return RAAssignment::kPhysNone;
}